

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  pointer pTVar1;
  pointer pTVar2;
  Enum EVar3;
  char *pcVar4;
  int in_EDX;
  
  if (decl->has_func_type == true) {
    pcVar4 = Var::index(&decl->type_var,(char *)&decl->type_var,in_EDX);
    return (Type)(Enum)pcVar4;
  }
  if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 == pTVar2) {
      return (Type)Void;
    }
    if ((long)pTVar2 - (long)pTVar1 == 4) {
      return (Type)pTVar1->enum_;
    }
  }
  EVar3 = Module::GetFuncTypeIndex(this->current_module_,decl);
  return (Type)EVar3;
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}